

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cc
# Opt level: O2

result_type_conflict1
time_plain<boost::random::lagged_fibonacci_01_engine<double,48,9689u,5502u>>
          (lagged_fibonacci_01_engine<double,_48,_9689U,_5502U> *r)

{
  time_t *in_RSI;
  long lVar1;
  bool bVar2;
  result_type_conflict1 rVar3;
  double extraout_XMM0_Qa;
  double local_58;
  timer T;
  string res;
  double local_20;
  
  T._resolution = 1e-06;
  T._t.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  local_58 = 0.0;
  lVar1 = 0x1000000;
  while (bVar2 = lVar1 != 0, lVar1 = lVar1 + -1, bVar2) {
    rVar3 = boost::random::lagged_fibonacci_01_engine<double,_48,_9689U,_5502U>::operator()(r);
    local_58 = local_58 + rVar3;
  }
  timer::time(&T,in_RSI);
  local_20 = 16.777216 / extraout_XMM0_Qa;
  to_string<double>(&res,&local_20);
  while (res._M_string_length < 10) {
    std::__cxx11::string::push_back((char)&res);
  }
  std::operator<<((ostream *)&std::cout,(string *)&res);
  std::__cxx11::string::~string((string *)&res);
  return local_58;
}

Assistant:

typename R::result_type time_plain(R &r) {
  typename R::result_type s{0};
  timer T;
  long max(1l << 24);
  for (long i{0}; i < max; ++i)
    s += r();
  std::string res(to_string(1e-6 * max / T.time()));
  while (res.length() < 10)
    res += ' ';
  std::cout << res;
  return s;
}